

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunnonlinsol_newton.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  long local_68;
  long niters;
  IntegratorMem Imem;
  SUNNonlinearSolver NLS;
  SUNLinearSolver LS;
  SUNMatrix A;
  N_Vector w;
  N_Vector y;
  N_Vector y0;
  N_Vector x;
  char **ppcStack_18;
  int retval;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  x._4_4_ = 0;
  ppcStack_18 = argv;
  argv_local._0_4_ = argc;
  niters = (long)malloc(0x18);
  y0 = (N_Vector)N_VNew_Serial(3);
  iVar1 = check_retval(y0,"N_VNew_Serial",0);
  if (iVar1 == 0) {
    y = N_VClone(y0);
    iVar1 = check_retval(y,"N_VNew_Serial",0);
    if (iVar1 == 0) {
      w = N_VClone(y0);
      iVar1 = check_retval(w,"N_VNew_Serial",0);
      if (iVar1 == 0) {
        A = (SUNMatrix)N_VClone(y0);
        iVar1 = check_retval(A,"N_VNew_Serial",0);
        if (iVar1 == 0) {
          **(undefined8 **)((long)y->content + 0x10) = 0x3fe0000000000000;
          *(undefined8 *)(*(long *)((long)y->content + 0x10) + 8) = 0x3fe0000000000000;
          *(undefined8 *)(*(long *)((long)y->content + 0x10) + 0x10) = 0x3fe0000000000000;
          **(undefined8 **)((long)A->content + 0x10) = 0x3ff0000000000000;
          *(undefined8 *)(*(long *)((long)A->content + 0x10) + 8) = 0x3ff0000000000000;
          *(undefined8 *)(*(long *)((long)A->content + 0x10) + 0x10) = 0x3ff0000000000000;
          LS = (SUNLinearSolver)SUNDenseMatrix(3);
          iVar1 = check_retval(LS,"SUNDenseMatrix",0);
          if (iVar1 == 0) {
            NLS = (SUNNonlinearSolver)SUNLinSol_Dense(w,LS);
            iVar1 = check_retval(NLS,"SUNLinSol_Dense",0);
            if (iVar1 == 0) {
              x._4_4_ = SUNLinSolInitialize((SUNLinearSolver)NLS);
              iVar1 = check_retval((void *)((long)&x + 4),"SUNLinSolInitialize",1);
              if (iVar1 == 0) {
                *(N_Vector *)niters = y0;
                *(SUNLinearSolver *)(niters + 8) = LS;
                *(SUNNonlinearSolver *)(niters + 0x10) = NLS;
                Imem = (IntegratorMem)SUNNonlinSol_Newton(w);
                iVar1 = check_retval(Imem,"SUNNonlinSol_Newton",0);
                if (iVar1 == 0) {
                  x._4_4_ = SUNNonlinSolSetSysFn((SUNNonlinearSolver)Imem,Res);
                  iVar1 = check_retval((void *)((long)&x + 4),"SUNNonlinSolSetSysFn",1);
                  if (iVar1 == 0) {
                    x._4_4_ = SUNNonlinSolSetLSetupFn((SUNNonlinearSolver)Imem,LSetup);
                    iVar1 = check_retval((void *)((long)&x + 4),"SUNNonlinSolSetSetupFn",1);
                    if (iVar1 == 0) {
                      x._4_4_ = SUNNonlinSolSetLSolveFn((SUNNonlinearSolver)Imem,LSolve);
                      iVar1 = check_retval((void *)((long)&x + 4),"SUNNonlinSolSetSolveFn",1);
                      if (iVar1 == 0) {
                        x._4_4_ = SUNNonlinSolSetConvTestFn((SUNNonlinearSolver)Imem,ConvTest);
                        iVar1 = check_retval((void *)((long)&x + 4),"SUNNonlinSolSetConvTestFn",1);
                        if (iVar1 == 0) {
                          x._4_4_ = SUNNonlinSolSetMaxIters((SUNNonlinearSolver)Imem,10);
                          iVar1 = check_retval((void *)((long)&x + 4),"SUNNonlinSolSetMaxIters",1);
                          if (iVar1 == 0) {
                            x._4_4_ = SUNNonlinSolSolve((SUNNonlinearSolver)Imem,y,w,(N_Vector)A,
                                                        0.01,1,(void *)niters);
                            iVar1 = check_retval((void *)((long)&x + 4),"SUNNonlinSolSolve",1);
                            if (iVar1 == 0) {
                              printf("Solution:\n");
                              printf("y1 = %g\n",**(undefined8 **)((long)w->content + 0x10));
                              printf("y2 = %g\n",
                                     *(undefined8 *)(*(long *)((long)w->content + 0x10) + 8));
                              printf("y3 = %g\n",
                                     *(undefined8 *)(*(long *)((long)w->content + 0x10) + 0x10));
                              printf("Solution Error:\n");
                              printf("e1 = %g\n",
                                     **(double **)((long)w->content + 0x10) - 0.7851969330623553);
                              printf("e2 = %g\n",
                                     *(double *)(*(long *)((long)w->content + 0x10) + 8) -
                                     0.4966113929446564);
                              printf("e3 = %g\n",
                                     *(double *)(*(long *)((long)w->content + 0x10) + 0x10) -
                                     0.36992283074587234);
                              x._4_4_ = SUNNonlinSolGetNumIters((SUNNonlinearSolver)Imem,&local_68);
                              iVar1 = check_retval((void *)((long)&x + 4),"SUNNonlinSolGetNumIters",
                                                   1);
                              if (iVar1 == 0) {
                                printf("Number of nonlinear iterations: %ld\n",local_68);
                                N_VDestroy(y0);
                                N_VDestroy(y);
                                N_VDestroy(w);
                                N_VDestroy((N_Vector)A);
                                SUNMatDestroy((SUNMatrix)LS);
                                SUNLinSolFree((SUNLinearSolver)NLS);
                                SUNNonlinSolFree((SUNNonlinearSolver)Imem);
                                free((void *)niters);
                                if (x._4_4_ == 0) {
                                  printf("SUCCESS\n");
                                }
                                else {
                                  printf("FAIL\n");
                                }
                                argv_local._4_4_ = x._4_4_;
                              }
                              else {
                                argv_local._4_4_ = 1;
                              }
                            }
                            else {
                              argv_local._4_4_ = 1;
                            }
                          }
                          else {
                            argv_local._4_4_ = 1;
                          }
                        }
                        else {
                          argv_local._4_4_ = 1;
                        }
                      }
                      else {
                        argv_local._4_4_ = 1;
                      }
                    }
                    else {
                      argv_local._4_4_ = 1;
                    }
                  }
                  else {
                    argv_local._4_4_ = 1;
                  }
                }
                else {
                  argv_local._4_4_ = 1;
                }
              }
              else {
                argv_local._4_4_ = 1;
              }
            }
            else {
              argv_local._4_4_ = 1;
            }
          }
          else {
            argv_local._4_4_ = 1;
          }
        }
        else {
          argv_local._4_4_ = 1;
        }
      }
      else {
        argv_local._4_4_ = 1;
      }
    }
    else {
      argv_local._4_4_ = 1;
    }
  }
  else {
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[]) 
{
  int                retval = 0;
  N_Vector           x, y0, y, w;
  SUNMatrix          A;
  SUNLinearSolver    LS;
  SUNNonlinearSolver NLS;
  IntegratorMem      Imem;
  long int           niters;
  
  /* create integrator memory */
  Imem = (IntegratorMem) malloc(sizeof(struct IntegratorMemRec));

  /* create vector */
  x  = N_VNew_Serial(NEQ);
  if (check_retval((void *)x, "N_VNew_Serial", 0)) return(1);

  y0 = N_VClone(x);
  if (check_retval((void *)y0, "N_VNew_Serial", 0)) return(1);

  y  = N_VClone(x);
  if (check_retval((void *)y, "N_VNew_Serial", 0)) return(1);

  w  = N_VClone(x);
  if (check_retval((void *)w, "N_VNew_Serial", 0)) return(1);

  /* set initial guess */
  NV_Ith_S(y0,0) = HALF;
  NV_Ith_S(y0,1) = HALF;
  NV_Ith_S(y0,2) = HALF;

  /* set weights */
  NV_Ith_S(w,0) = ONE;
  NV_Ith_S(w,1) = ONE;
  NV_Ith_S(w,2) = ONE;
  
  /* create dense matrix */
  A = SUNDenseMatrix(NEQ, NEQ);
  if (check_retval((void *)A, "SUNDenseMatrix", 0)) return(1);

  /* create dense linear solver */
  LS  = SUNLinSol_Dense(y, A);
  if (check_retval((void *)LS, "SUNLinSol_Dense", 0)) return(1);

  /* initialize the linear solver */
  retval = SUNLinSolInitialize(LS);
  if (check_retval(&retval, "SUNLinSolInitialize", 1)) return(1);

  /* set integrator memory */
  Imem->x  = x;
  Imem->A  = A;
  Imem->LS = LS;

  /* create nonlinear solver */
  NLS = SUNNonlinSol_Newton(y);
  if (check_retval((void *)NLS, "SUNNonlinSol_Newton", 0)) return(1);

  /* set the nonlinear residual function */
  retval = SUNNonlinSolSetSysFn(NLS, Res);
  if (check_retval(&retval, "SUNNonlinSolSetSysFn", 1)) return(1);

  /* set the wrapper functions to linear solver setup and solve functions */
  retval = SUNNonlinSolSetLSetupFn(NLS, LSetup);
  if (check_retval(&retval, "SUNNonlinSolSetSetupFn", 1)) return(1);

  retval = SUNNonlinSolSetLSolveFn(NLS, LSolve);
  if (check_retval(&retval, "SUNNonlinSolSetSolveFn", 1)) return(1);

  retval = SUNNonlinSolSetConvTestFn(NLS, ConvTest);
  if (check_retval(&retval, "SUNNonlinSolSetConvTestFn", 1)) return(1);

  /* set the maximum number of nonlinear iterations */
  retval = SUNNonlinSolSetMaxIters(NLS, MAXIT);
  if (check_retval(&retval, "SUNNonlinSolSetMaxIters", 1)) return(1);

  /* solve the nonlinear system */
  retval = SUNNonlinSolSolve(NLS, y0, y, w, TOL, SUNTRUE, Imem);
  if (check_retval(&retval, "SUNNonlinSolSolve", 1)) return(1);

  /* print the solution */
  printf("Solution:\n");
  printf("y1 = %g\n",NV_Ith_S(y,0));
  printf("y2 = %g\n",NV_Ith_S(y,1));
  printf("y3 = %g\n",NV_Ith_S(y,2));

  /* print the solution error */
  printf("Solution Error:\n");
  printf("e1 = %g\n",NV_Ith_S(y,0) - Y1);
  printf("e2 = %g\n",NV_Ith_S(y,1) - Y2);
  printf("e3 = %g\n",NV_Ith_S(y,2) - Y3);

  /* get the number of linear iterations */
  retval = SUNNonlinSolGetNumIters(NLS, &niters);
  if (check_retval(&retval, "SUNNonlinSolGetNumIters", 1)) return(1);

  printf("Number of nonlinear iterations: %ld\n",niters);

  /* Free vector, matrix, linear solver, and nonlinear solver */
  N_VDestroy(x);
  N_VDestroy(y0);
  N_VDestroy(y);
  N_VDestroy(w);
  SUNMatDestroy(A);
  SUNLinSolFree(LS);
  SUNNonlinSolFree(NLS);
  free(Imem);

  /* Print result */
  if (retval) {
    printf("FAIL\n");
  } else {
    printf("SUCCESS\n");
  }

  return(retval);
}